

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

void __thiscall Amiga::Chipset::DiskDMA::enqueue(DiskDMA *this,uint16_t value,bool matches_sync)

{
  size_t sVar1;
  
  if (this->state_ == WaitingForSync && matches_sync) {
    this->state_ = Reading;
    return;
  }
  if (this->state_ == Reading) {
    sVar1 = this->buffer_write_;
    (this->buffer_)._M_elems[(uint)sVar1 & 3] = value;
    if (sVar1 == this->buffer_read_ + 4) {
      this->buffer_read_ = this->buffer_read_ + 1;
    }
    this->buffer_write_ = sVar1 + 1;
  }
  return;
}

Assistant:

void Chipset::DiskDMA::enqueue(uint16_t value, bool matches_sync) {
	if(matches_sync && state_ == State::WaitingForSync) {
		state_ = State::Reading;
		return;
	}

	if(state_ == State::Reading) {
		buffer_[buffer_write_ & 3] = value;
		if(buffer_write_ == buffer_read_ + 4) {
			++buffer_read_;
		}
		++buffer_write_;
	}
}